

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pass.cpp
# Opt level: O1

void __thiscall jsonnet::internal::CompilerPass::visit(CompilerPass *this,Array *ast)

{
  pointer pEVar1;
  Element *element;
  pointer pEVar2;
  
  pEVar1 = (ast->elements).
           super__Vector_base<jsonnet::internal::Array::Element,_std::allocator<jsonnet::internal::Array::Element>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pEVar2 = (ast->elements).
                super__Vector_base<jsonnet::internal::Array::Element,_std::allocator<jsonnet::internal::Array::Element>_>
                ._M_impl.super__Vector_impl_data._M_start; pEVar2 != pEVar1; pEVar2 = pEVar2 + 1) {
    (*this->_vptr_CompilerPass[6])(this,pEVar2);
    (*this->_vptr_CompilerPass[1])(this,&pEVar2->commaFodder);
  }
  (*this->_vptr_CompilerPass[1])(this,&ast->closeFodder);
  return;
}

Assistant:

void CompilerPass::visit(Array *ast)
{
    for (auto &element : ast->elements) {
        expr(element.expr);
        fodder(element.commaFodder);
    }
    fodder(ast->closeFodder);
}